

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O2

PipelineResourceSignatureInternalDataVk * __thiscall
Diligent::PipelineResourceSignatureVkImpl::GetInternalData
          (PipelineResourceSignatureInternalDataVk *__return_storage_ptr__,
          PipelineResourceSignatureVkImpl *this)

{
  Uint16 UVar1;
  
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetInternalData
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
  UVar1 = this->m_DynamicStorageBufferCount;
  __return_storage_ptr__->DynamicUniformBufferCount = this->m_DynamicUniformBufferCount;
  __return_storage_ptr__->DynamicStorageBufferCount = UVar1;
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureInternalDataVk PipelineResourceSignatureVkImpl::GetInternalData() const
{
    PipelineResourceSignatureInternalDataVk InternalData = TPipelineResourceSignatureBase::GetInternalData();

    InternalData.DynamicStorageBufferCount = m_DynamicStorageBufferCount;
    InternalData.DynamicUniformBufferCount = m_DynamicUniformBufferCount;

    return InternalData;
}